

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_device_uninit__null(ma_device *pDevice)

{
  if (pDevice != (ma_device *)0x0) {
    ma_device_do_operation__null(pDevice,3);
    ma_thread_wait((ma_thread *)&pDevice->field_24);
    ma_semaphore_uninit(&(pDevice->field_24).null_device.operationSemaphore);
    ma_event_uninit(&(pDevice->field_24).null_device.operationCompletionEvent);
    ma_event_uninit(&(pDevice->field_24).null_device.operationEvent);
    return MA_SUCCESS;
  }
  __assert_fail("pDevice != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O2/_deps/raylib-src/src/external/miniaudio.h"
                ,0x4c61,"ma_result ma_device_uninit__null(ma_device *)");
}

Assistant:

static ma_result ma_device_uninit__null(ma_device* pDevice)
{
    MA_ASSERT(pDevice != NULL);

    /* Keep it clean and wait for the device thread to finish before returning. */
    ma_device_do_operation__null(pDevice, MA_DEVICE_OP_KILL__NULL);

    /* Wait for the thread to finish before continuing. */
    ma_thread_wait(&pDevice->null_device.deviceThread);

    /* At this point the loop in the device thread is as good as terminated so we can uninitialize our events. */
    ma_semaphore_uninit(&pDevice->null_device.operationSemaphore);
    ma_event_uninit(&pDevice->null_device.operationCompletionEvent);
    ma_event_uninit(&pDevice->null_device.operationEvent);

    return MA_SUCCESS;
}